

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_future.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  undefined1 local_48 [8];
  tst_future tc;
  QCoreApplication local_28 [8];
  QCoreApplication app;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  argv_local._0_4_ = argc;
  QTest::Internal::callInitMain<tst_future>();
  QCoreApplication::QCoreApplication(local_28,(int *)&argv_local,argv,0x60204);
  QCoreApplication::setAttribute(AA_Use96Dpi,true);
  tst_future::tst_future((tst_future *)local_48);
  QTest::setMainSourcePath
            ("/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/future/tst_future.cpp"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/build_O0/tests/auto/qtpromise/future"
            );
  argv_local._4_4_ = QTest::qExec((QObject *)local_48,(int)argv_local,argv);
  tst_future::~tst_future((tst_future *)local_48);
  QCoreApplication::~QCoreApplication(local_28);
  return argv_local._4_4_;
}

Assistant:

void tst_future::fulfilled()
{
    int result = -1;
    auto p = QtPromise::resolve(QtConcurrent::run([]() {
        return 42;
    }));

    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<int>>::value));
    QCOMPARE(p.isPending(), true);

    p.then([&](int res) {
         result = res;
     }).wait();

    QCOMPARE(p.isFulfilled(), true);
    QCOMPARE(result, 42);
}